

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O2

void radio_draw_select(t_radio *x,_glist *glist)

{
  t_iem_fstyle_flags tVar1;
  _glist *in_RAX;
  _glist *p_Var2;
  int iVar3;
  char tag [128];
  char local_b8 [136];
  
  p_Var2 = glist_getcanvas(in_RAX);
  tVar1 = (x->x_gui).x_fsf;
  iVar3 = 0xff;
  if (((uint)tVar1 >> 0x18 & 1) == 0) {
    iVar3 = (x->x_gui).x_lcol;
  }
  sprintf(local_b8,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-outline",
              ((int)tVar1 << 7) >> 0x1f & 0xff);
  sprintf(local_b8,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-fill",iVar3);
  return;
}

Assistant:

static void radio_draw_select(t_radio* x, t_glist* glist)
{
    int n = x->x_number, i;
    t_canvas *canvas = glist_getcanvas(glist);
    int lcol = x->x_gui.x_lcol;
    int col = IEM_GUI_COLOR_NORMAL;
    char tag[128];

    if(x->x_gui.x_fsf.x_selected)
        lcol = col =  IEM_GUI_COLOR_SELECTED;

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", lcol);
}